

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Temp.cpp
# Opt level: O2

string * __thiscall
DragonParser::InterNamespace::Temp::to_string_abi_cxx11_(string *__return_storage_ptr__,Temp *this)

{
  string local_30;
  
  std::__cxx11::to_string(&local_30,this->number);
  std::operator+(__return_storage_ptr__,"t",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string Temp::to_string() const {
        return "t" + std::to_string(number);
    }